

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_jump(command *cmd)

{
  loc_conflict grid_00;
  loc_conflict grid_01;
  _Bool _Var1;
  wchar_t wVar2;
  trap_kind_conflict1 *ptVar3;
  trap_kind *web;
  loc_conflict lStack_18;
  wchar_t dir;
  loc_conflict grid;
  command *cmd_local;
  
  grid = (loc_conflict)cmd;
  wVar2 = cmd_get_direction(cmd,"direction",(int *)((long)&web + 4),false);
  if (wVar2 == L'\0') {
    grid_00.x = (player->grid).x;
    grid_00.y = (player->grid).y;
    _Var1 = square_iswebbed((chunk *)cave,grid_00);
    if (_Var1) {
      ptVar3 = lookup_trap("web");
      msg("You clear the web.");
      if (ptVar3 == (trap_kind_conflict1 *)0x0) {
        __assert_fail("web",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-cave.c"
                      ,0x529,"void do_cmd_jump(struct command *)");
      }
      grid_01.x = (player->grid).x;
      grid_01.y = (player->grid).y;
      square_remove_all_traps_of_type((chunk_conflict2 *)cave,grid_01,ptVar3->tidx);
      player->upkeep->energy_use = (uint)z_info->move_energy;
    }
    else {
      _Var1 = player_confuse_dir(player,(int *)((long)&web + 4),false);
      if (_Var1) {
        player->upkeep->energy_use = (uint)z_info->move_energy;
      }
      lStack_18 = (loc_conflict)loc_sum(player->grid,ddgrid[web._4_4_]);
      _Var1 = do_cmd_walk_test(player,lStack_18);
      if (_Var1) {
        wVar2 = energy_per_move(player);
        player->upkeep->energy_use = wVar2;
        move_player(web._4_4_,false);
      }
    }
  }
  return;
}

Assistant:

void do_cmd_jump(struct command *cmd)
{
	struct loc grid;
	int dir;

	/* Get arguments */
	if (cmd_get_direction(cmd, "direction", &dir, false) != CMD_OK)
		return;

	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, player->grid)) {
		/* Clear the web, finish turn */
		struct trap_kind *web = lookup_trap("web");

		msg("You clear the web.");
		assert(web);
		square_remove_all_traps_of_type(cave, player->grid, web->tidx);
		player->upkeep->energy_use = z_info->move_energy;
		return;
	}

	/* Apply confusion if necessary */
	if (player_confuse_dir(player, &dir, false))
		player->upkeep->energy_use = z_info->move_energy;

	/* Verify walkability */
	grid = loc_sum(player->grid, ddgrid[dir]);
	if (!do_cmd_walk_test(player, grid))
		return;

	player->upkeep->energy_use = energy_per_move(player);

	move_player(dir, false);
}